

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O2

void __thiscall benchmark::State::SetLabel(State *this,char *label)

{
  Mutex *__m;
  MutexLock l;
  unique_lock<std::mutex> uStack_18;
  
  if ((anonymous_namespace)::running_benchmark != '\0') {
    internal::GetNullLogInstance();
    __m = GetBenchmarkLock();
    std::unique_lock<std::mutex>::unique_lock(&uStack_18,&__m->mut_);
    (anonymous_namespace)::GetReportLabel_abi_cxx11_();
    std::__cxx11::string::assign
              ((char *)&(anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_);
    std::unique_lock<std::mutex>::~unique_lock(&uStack_18);
    return;
  }
  internal::CheckHandler::CheckHandler
            ((CheckHandler *)&uStack_18,"running_benchmark",
             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
             ,"SetLabel",0x3f4);
  internal::CheckHandler::~CheckHandler((CheckHandler *)&uStack_18);
}

Assistant:

void State::SetLabel(const char* label) {
  CHECK(running_benchmark);
  MutexLock l(GetBenchmarkLock());
  *GetReportLabel() = label;
}